

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

iterator __thiscall
absl::
InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
::erase(InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
        *this,const_iterator pos)

{
  iterator pPVar1;
  iterator pPVar2;
  Iterator<std::allocator<absl::status_internal::Payload>_> pPVar3;
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  iterator local_18;
  const_iterator pos_local;
  InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
  *this_local;
  
  local_18 = pos;
  pos_local = (const_iterator)this;
  pPVar1 = begin(this);
  if (pos < pPVar1) {
    erase::anon_class_1_0_00000001::operator()(&local_19);
  }
  pPVar1 = local_18;
  pPVar2 = end(this);
  if (pPVar2 <= pPVar1) {
    erase::anon_class_1_0_00000001::operator()(&local_1a);
  }
  pPVar3 = inlined_vector_internal::
           Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
           ::Erase(&this->storage_,local_18,local_18 + 1);
  return pPVar3;
}

Assistant:

iterator erase(const_iterator pos) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    ABSL_HARDENING_ASSERT(pos >= begin());
    ABSL_HARDENING_ASSERT(pos < end());

    // https://gcc.gnu.org/bugzilla/show_bug.cgi?id=102329#c2
    // It appears that GCC thinks that since `pos` is a const pointer and may
    // point to uninitialized memory at this point, a warning should be
    // issued. But `pos` is actually only used to compute an array index to
    // write to.
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#pragma GCC diagnostic ignored "-Wuninitialized"
#endif
    return storage_.Erase(pos, pos + 1);
#if !defined(__clang__) && defined(__GNUC__)
#pragma GCC diagnostic pop
#endif
  }